

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O1

void __thiscall
particle_decay::perform_three_body_decay
          (particle_decay *this,particle_info *mother,particle_info *daughter1,
          particle_info *daughter2,particle_info *daughter3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  element_type *peVar7;
  element_type *peVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined4 uVar26;
  mapped_type *pmVar27;
  ostream *poVar28;
  long lVar29;
  particle_info *ppVar30;
  key_type *pkVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dStack_250;
  double dStack_200;
  double dStack_1f0;
  double dStack_140;
  key_type local_a8 [30];
  
  dVar36 = mother->mass;
  ppVar30 = mother;
  pkVar31 = local_a8;
  for (lVar29 = 0xf; lVar29 != 0; lVar29 = lVar29 + -1) {
    uVar26 = *(undefined4 *)&ppVar30->field_0x4;
    pkVar31[0] = ppVar30->monval;
    pkVar31[1] = uVar26;
    ppVar30 = (particle_info *)&ppVar30->mass;
    pkVar31 = pkVar31 + 2;
  }
  pmVar27 = std::
            map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
            ::at(&this->resonance_table_,local_a8);
  dVar1 = daughter1->mass;
  dVar2 = daughter2->mass;
  dVar3 = daughter3->mass;
  if (dVar1 + dVar2 + dVar3 <= dVar36) {
    dVar4 = pmVar27->width;
    dVar35 = ((dVar36 - dVar1) - dVar2) - dVar3;
    do {
      do {
        peVar7 = (this->ran_gen_ptr_).
                 super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar12 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)(peVar7->ran_generator)._M_t.
                               super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               .
                               super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                           );
        peVar8 = (this->ran_gen_ptr_).
                 super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar38 = (peVar7->rand_uniform_dist)._M_param._M_a;
        dVar37 = (peVar7->rand_uniform_dist)._M_param._M_b;
        dVar13 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)(peVar8->ran_generator)._M_t.
                               super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                               .
                               super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                           );
        dVar5 = (peVar8->rand_uniform_dist)._M_param._M_a;
        dVar38 = (dVar12 * (dVar37 - dVar38) + dVar38) * dVar35 + dVar1;
        dVar37 = (dVar13 * ((peVar8->rand_uniform_dist)._M_param._M_b - dVar5) + dVar5) * dVar35 +
                 dVar2;
      } while (dVar36 < dVar38 + dVar37);
      dVar5 = dVar38 * dVar38 + -dVar1 * dVar1;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar12 = dVar37 * dVar37 + -dVar2 * dVar2;
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar37 = (dVar36 - dVar38) - dVar37;
      dVar38 = (((dVar37 * dVar37 - dVar5 * dVar5) - dVar12 * dVar12) + -dVar3 * dVar3) /
               ((dVar5 + dVar5) * dVar12);
    } while (1.0 < ABS(dVar38));
    if (dVar4 <= 1e-10) {
      dVar36 = 10000000000.0;
    }
    else {
      dVar35 = mother->E;
      peVar7 = (this->ran_gen_ptr_).
               super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      dVar13 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)(peVar7->ran_generator)._M_t.
                             super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                             .
                             super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                         );
      dVar37 = (peVar7->rand_uniform_dist)._M_param._M_a;
      dVar37 = log(dVar13 * ((peVar7->rand_uniform_dist)._M_param._M_b - dVar37) + dVar37);
      dVar36 = dVar37 * ((dVar35 / dVar36) / dVar4) * -0.19733;
    }
    dVar37 = mother->t + dVar36;
    dVar4 = mother->E;
    dVar13 = (mother->pz / dVar4) * dVar36 + mother->z;
    dVar32 = dVar12 * dVar38;
    dVar35 = 1.0 - dVar38 * dVar38;
    dVar33 = -(dVar5 + dVar32);
    dVar38 = mother->x;
    dVar43 = mother->y;
    auVar42._0_8_ = mother->px;
    auVar42._8_8_ = mother->py;
    if (dVar35 < 0.0) {
      dVar35 = sqrt(dVar35);
    }
    else {
      dVar35 = SQRT(dVar35);
    }
    dVar12 = dVar12 * dVar35;
    dVar44 = -dVar12;
    peVar7 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar41 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar7->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar35 = (peVar7->rand_uniform_dist)._M_param._M_a;
    dVar41 = (dVar41 * ((peVar7->rand_uniform_dist)._M_param._M_b - dVar35) + dVar35) *
             6.283185307179586;
    peVar7 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar14 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar7->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar35 = (peVar7->rand_uniform_dist)._M_param._M_a;
    dVar14 = (dVar14 * ((peVar7->rand_uniform_dist)._M_param._M_b - dVar35) + dVar35) *
             6.283185307179586;
    peVar7 = (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    dVar15 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(peVar7->ran_generator)._M_t.
                           super___uniq_ptr_impl<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                           .
                           super__Head_base<0UL,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_*,_false>
                       );
    dVar35 = (peVar7->rand_uniform_dist)._M_param._M_a;
    dVar35 = ((peVar7->rand_uniform_dist)._M_param._M_b - dVar35) * dVar15 + dVar35;
    dVar22 = dVar35 + dVar35 + -1.0;
    dVar35 = sin(dVar41);
    dVar41 = cos(dVar41);
    dVar15 = sin(dVar14);
    dVar14 = cos(dVar14);
    dVar16 = 1.0 - dVar22 * dVar22;
    if (dVar16 < 0.0) {
      dVar16 = sqrt(dVar16);
    }
    else {
      dVar16 = SQRT(dVar16);
    }
    dVar24 = dVar5 * dVar22;
    dVar34 = dVar41 * dVar16 * dVar12 + dVar32 * dVar22;
    auVar9._8_4_ = SUB84(dVar16,0);
    auVar9._0_8_ = dVar16;
    auVar9._12_4_ = (int)((ulong)dVar16 >> 0x20);
    dVar19 = -dVar5 * dVar16 * dVar14;
    dVar20 = dVar5 * dVar16 * dVar15;
    auVar17._8_4_ = SUB84(dVar20,0);
    auVar17._0_8_ = dVar19;
    auVar17._12_4_ = (int)((ulong)dVar20 >> 0x20);
    dVar1 = dVar24 * dVar24 + dVar20 * dVar20 + dVar1 * dVar1 + dVar19 * dVar19;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    auVar25._8_8_ = dVar4;
    auVar25._0_8_ = dVar4;
    auVar42 = divpd(auVar42,auVar25);
    dVar39 = dVar41 * dVar44 * dVar16 + dVar22 * dVar33;
    dVar40 = dVar22 * dVar41 * dVar14 + -dVar35 * dVar15;
    dVar41 = dVar22 * -dVar41 * dVar15 + -dVar35 * dVar14;
    dVar4 = dVar12 * dVar40 + -(dVar32 * dVar16) * dVar14;
    dVar35 = dVar12 * dVar41 + dVar32 * dVar16 * dVar15;
    dVar2 = dVar34 * dVar34 + dVar35 * dVar35 + dVar2 * dVar2 + dVar4 * dVar4;
    auVar21._8_4_ = SUB84(dVar35,0);
    auVar21._0_8_ = dVar4;
    auVar21._12_4_ = (int)((ulong)dVar35 >> 0x20);
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dStack_140 = auVar9._8_8_;
    dVar5 = dVar44 * dVar40 + dVar14 * (dVar5 + dVar32) * dVar16;
    dVar12 = dVar44 * dVar41 + dVar33 * dVar15 * dStack_140;
    auVar18._8_4_ = SUB84(dVar12,0);
    auVar18._0_8_ = dVar5;
    auVar18._12_4_ = (int)((ulong)dVar12 >> 0x20);
    dVar3 = dVar39 * dVar39 + dVar12 * dVar12 + dVar3 * dVar3 + dVar5 * dVar5;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar38 = auVar42._0_8_ * dVar36 + dVar38;
    dVar43 = auVar42._8_8_ * dVar36 + dVar43;
    dVar36 = mother->E;
    auVar6._0_8_ = mother->px;
    auVar6._8_8_ = mother->py;
    dVar41 = mother->pz / dVar36;
    auVar10._8_4_ = SUB84(dVar36,0);
    auVar10._0_8_ = dVar36;
    auVar10._12_4_ = (int)((ulong)dVar36 >> 0x20);
    auVar42 = divpd(auVar6,auVar10);
    dVar44 = auVar42._8_8_;
    dVar33 = auVar42._0_8_;
    dVar32 = dVar41 * dVar41 + dVar33 * dVar33 + dVar44 * dVar44;
    dVar36 = 1.0 - dVar32;
    if (dVar36 < 0.0) {
      dVar36 = sqrt(dVar36);
    }
    else {
      dVar36 = SQRT(dVar36);
    }
    dVar36 = 1.0 / dVar36;
    dStack_1f0 = auVar17._8_8_;
    dVar15 = dVar41 * dVar24 + dVar33 * dVar19 + dVar20 * dVar44;
    dStack_200 = auVar21._8_8_;
    dVar14 = dVar41 * dVar34 + dVar4 * dVar33 + dVar35 * dVar44;
    dStack_250 = auVar18._8_8_;
    dVar35 = dVar41 * dVar39 + dVar5 * dVar33 + dVar12 * dVar44;
    daughter1->E = (dVar1 + dVar15) * dVar36;
    dVar12 = dVar36 + -1.0;
    dVar1 = (dVar15 * dVar12) / dVar32 + dVar36 * dVar1;
    daughter1->px = dVar1 * dVar33 + dVar19;
    daughter1->py = dVar1 * dVar44 + dStack_1f0;
    daughter1->pz = dVar1 * dVar41 + dVar24;
    daughter1->t = dVar37;
    daughter1->x = dVar38;
    daughter1->y = dVar43;
    daughter1->z = dVar13;
    daughter2->E = (dVar2 + dVar14) * dVar36;
    dVar1 = (dVar14 * dVar12) / dVar32 + dVar36 * dVar2;
    dVar4 = dVar1 * dVar33 + dVar4;
    dStack_200 = dVar1 * dVar44 + dStack_200;
    auVar23._8_4_ = SUB84(dStack_200,0);
    auVar23._0_8_ = dVar4;
    auVar23._12_4_ = (int)((ulong)dStack_200 >> 0x20);
    daughter2->px = dVar4;
    daughter2->py = (double)auVar23._8_8_;
    daughter2->pz = dVar1 * dVar41 + dVar34;
    daughter2->t = dVar37;
    daughter2->x = dVar38;
    daughter2->y = dVar43;
    daughter2->z = dVar13;
    daughter3->E = (dVar3 + dVar35) * dVar36;
    dVar36 = dVar36 * dVar3 + (dVar35 * dVar12) / dVar32;
    dVar5 = dVar36 * dVar33 + dVar5;
    dStack_250 = dVar36 * dVar44 + dStack_250;
    auVar11._8_4_ = SUB84(dStack_250,0);
    auVar11._0_8_ = dVar5;
    auVar11._12_4_ = (int)((ulong)dStack_250 >> 0x20);
    daughter3->px = dVar5;
    daughter3->py = (double)auVar11._8_8_;
    daughter3->pz = dVar36 * dVar41 + dVar39;
    daughter3->t = dVar37;
    daughter3->x = dVar38;
    daughter3->y = dVar43;
    daughter3->z = dVar13;
    return;
  }
  poVar28 = std::operator<<((ostream *)&std::cout,"Error:particleSamples::perform_three_body_decay:"
                           );
  poVar28 = std::operator<<(poVar28,"can not found decays!");
  std::endl<char,std::char_traits<char>>(poVar28);
  poVar28 = std::operator<<((ostream *)&std::cout,"M = ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,dVar36);
  poVar28 = std::operator<<(poVar28,", m1 = ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,dVar1);
  poVar28 = std::operator<<(poVar28,", m2 = ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,dVar2);
  poVar28 = std::operator<<(poVar28,", m3 = ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,dVar3);
  std::endl<char,std::char_traits<char>>(poVar28);
  poVar28 = std::operator<<((ostream *)&std::cout,"reso: ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,mother->monval);
  poVar28 = std::operator<<(poVar28,", m1: ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,daughter1->monval);
  poVar28 = std::operator<<(poVar28,", m2: ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,daughter2->monval);
  poVar28 = std::operator<<(poVar28,", m3: ");
  poVar28 = (ostream *)std::ostream::operator<<(poVar28,daughter3->monval);
  std::endl<char,std::char_traits<char>>(poVar28);
  exit(1);
}

Assistant:

void particle_decay::perform_three_body_decay(
    particle_info &mother, particle_info &daughter1, particle_info &daughter2,
    particle_info &daughter3) {
    double M_pole = mother.mass;
    double M_width = get_particle_width(mother);
    double m1 = daughter1.mass;
    double m2 = daughter2.mass;
    double m3 = daughter3.mass;
    double M_min = m1 + m2 + m3;
    if (M_pole < M_min) {
        cout << "Error:particleSamples::perform_three_body_decay:"
             << "can not found decays!" << endl;
        cout << "M = " << M_pole << ", m1 = " << m1 << ", m2 = " << m2
             << ", m3 = " << m3 << endl;
        cout << "reso: " << mother.monval << ", m1: " << daughter1.monval
             << ", m2: " << daughter2.monval << ", m3: " << daughter3.monval
             << endl;
        exit(1);
    }
    // double M_sampled = sample_breit_wigner(M_pole, M_width, M_min);
    double M_sampled = M_pole;
    // generate lrf E1, E2, and theta12 using accept and reject method
    double E1_lrf, E2_lrf, E3_lrf, p1_lrf, p2_lrf, cos12_lrf;
    do {
        do {
            E1_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m1;
            E2_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m2;
        } while (E1_lrf + E2_lrf > M_sampled);
        p1_lrf = sqrt(E1_lrf * E1_lrf - m1 * m1);
        p2_lrf = sqrt(E2_lrf * E2_lrf - m2 * m2);
        double E3_lrf = M_sampled - E1_lrf - E2_lrf;
        cos12_lrf =
            (E3_lrf * E3_lrf - p1_lrf * p1_lrf - p2_lrf * p2_lrf - m3 * m3)
            / (2. * p1_lrf * p2_lrf);
    } while (cos12_lrf < -1.0 || cos12_lrf > 1.0);
    // now we get the a good sample

    // sample the lifetime
    double life_time = 1e10;
    if (M_width > 1e-10) {
        double tau = mother.E / (M_sampled) * 1. / M_width;
        life_time = -tau * log(ran_gen_ptr_->rand_uniform());
        life_time *= AfterburnerUtil::hbarc;  // convert unit to fm
    }
    // compute the decay position
    double decay_time = mother.t + life_time;
    double decay_x = mother.x + mother.px / mother.E * life_time;
    double decay_y = mother.y + mother.py / mother.E * life_time;
    double decay_z = mother.z + mother.pz / mother.E * life_time;

    // compute the momentum of decay daughters
    double tp2_lrf_x = p2_lrf * sqrt(1. - cos12_lrf * cos12_lrf);
    double tp2_lrf_z = p2_lrf * cos12_lrf;
    double tp3_lrf_x = -tp2_lrf_x;
    double tp3_lrf_z = -(p1_lrf + tp2_lrf_z);
    double phi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double ksi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double cos_theta = 2. * ran_gen_ptr_->rand_uniform() - 1.0;

    double sin_phi = sin(phi);
    double cos_phi = cos(phi);
    double sin_ksi = sin(ksi);
    double cos_ksi = cos(ksi);
    double sin_theta = sqrt(1. - cos_theta * cos_theta);

    double p1_lrf_x = -p1_lrf * sin_theta * cos_ksi;
    double p1_lrf_y = p1_lrf * sin_theta * sin_ksi;
    double p1_lrf_z = p1_lrf * cos_theta;
    E1_lrf = sqrt(
        m1 * m1 + p1_lrf_x * p1_lrf_x + p1_lrf_y * p1_lrf_y
        + p1_lrf_z * p1_lrf_z);
    double p2_lrf_x =
        (tp2_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp2_lrf_z * sin_theta * cos_ksi);
    double p2_lrf_y =
        (tp2_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp2_lrf_z * sin_theta * sin_ksi);
    double p2_lrf_z = tp2_lrf_x * (cos_phi * sin_theta) + tp2_lrf_z * cos_theta;
    E2_lrf = sqrt(
        m2 * m2 + p2_lrf_x * p2_lrf_x + p2_lrf_y * p2_lrf_y
        + p2_lrf_z * p2_lrf_z);
    double p3_lrf_x =
        (tp3_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp3_lrf_z * sin_theta * cos_ksi);
    double p3_lrf_y =
        (tp3_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp3_lrf_z * (sin_theta * sin_ksi));
    double p3_lrf_z = tp3_lrf_x * cos_phi * sin_theta + tp3_lrf_z * cos_theta;
    E3_lrf = sqrt(
        m3 * m3 + p3_lrf_x * p3_lrf_x + p3_lrf_y * p3_lrf_y
        + p3_lrf_z * p3_lrf_z);

    double vx = mother.px / mother.E;
    double vy = mother.py / mother.E;
    double vz = mother.pz / mother.E;
    double v2 = vx * vx + vy * vy + vz * vz;
    double gamma = 1. / sqrt(1. - v2);
    double gamma_m_1 = gamma - 1.;
    double vp1 = vx * p1_lrf_x + vy * p1_lrf_y + vz * p1_lrf_z;
    double vp2 = vx * p2_lrf_x + vy * p2_lrf_y + vz * p2_lrf_z;
    double vp3 = vx * p3_lrf_x + vy * p3_lrf_y + vz * p3_lrf_z;

    daughter1.E = gamma * (E1_lrf + vp1);
    daughter1.px = p1_lrf_x + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vx;
    daughter1.py = p1_lrf_y + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vy;
    daughter1.pz = p1_lrf_z + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vz;
    daughter1.t = decay_time;
    daughter1.x = decay_x;
    daughter1.y = decay_y;
    daughter1.z = decay_z;

    daughter2.E = gamma * (E2_lrf + vp2);
    daughter2.px = p2_lrf_x + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vx;
    daughter2.py = p2_lrf_y + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vy;
    daughter2.pz = p2_lrf_z + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vz;
    daughter2.t = decay_time;
    daughter2.x = decay_x;
    daughter2.y = decay_y;
    daughter2.z = decay_z;

    daughter3.E = gamma * (E3_lrf + vp3);
    daughter3.px = p3_lrf_x + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vx;
    daughter3.py = p3_lrf_y + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vy;
    daughter3.pz = p3_lrf_z + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vz;
    daughter3.t = decay_time;
    daughter3.x = decay_x;
    daughter3.y = decay_y;
    daughter3.z = decay_z;
}